

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::InspectInstrForMemCopyCandidate
          (GlobOpt *this,Loop *loop,Instr *instr,MemCopyEmitData *emitData,bool *errorInInstr)

{
  OpCode OVar1;
  undefined2 other;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  SymID SVar5;
  BailOutKind BVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  IndirOpnd *pIVar10;
  StackSym *pSVar11;
  JITTimeFunctionBody *pJVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  char16_t *form;
  GlobOpt *pGVar15;
  MemOpCandidate *pMVar16;
  wchar local_4a8 [4];
  char16 ldValueTypeStr [256];
  char16 debugStringBuffer [42];
  wchar local_a8 [4];
  char16 debugStringBuffer_1 [42];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  ValueType stValueType;
  ValueType ldValueType;
  
  if (((emitData == (MemCopyEmitData *)0x0) ||
      (pMVar16 = (emitData->super_MemOpEmitData).candidate, pMVar16 == (MemOpCandidate *)0x0)) ||
     (pMVar16->type != MEMCOPY)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4472,
                       "(emitData && emitData->candidate && emitData->candidate->IsMemCopy())",
                       "emitData && emitData->candidate && emitData->candidate->IsMemCopy()");
    if (!bVar3) goto LAB_00444d88;
    *puVar9 = 0;
    pMVar16 = (emitData->super_MemOpEmitData).candidate;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 == LdElemI_A) {
    if (((emitData->super_MemOpEmitData).stElemInstr != (Instr *)0x0) &&
       (bVar3 = IR::Opnd::IsIndirOpnd(instr->m_src1), bVar3)) {
      pIVar10 = IR::Opnd::AsIndirOpnd(instr->m_src1);
      pGVar15 = (GlobOpt *)pIVar10->m_baseOpnd;
      pSVar11 = IR::Opnd::GetStackSym((Opnd *)pGVar15);
      SVar5 = GetVarSymID(pGVar15,pSVar11);
      if (SVar5 == pMVar16[1].base) {
        pIVar10 = IR::Opnd::AsIndirOpnd(instr->m_src1);
        pGVar15 = (GlobOpt *)pIVar10->m_indexOpnd;
        pSVar11 = IR::Opnd::GetStackSym((Opnd *)pGVar15);
        SVar5 = GetVarSymID(pGVar15,pSVar11);
        if (SVar5 == pMVar16->index) {
          if (instr->m_kind != InstrKindProfiled) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar9 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x448e,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
            if (!bVar3) goto LAB_00444d88;
            *puVar9 = 0;
          }
          emitData->ldElemInstr = instr;
          pIVar10 = IR::Opnd::AsIndirOpnd(((emitData->super_MemOpEmitData).stElemInstr)->m_dst);
          local_34 = (pIVar10->m_baseOpnd->super_Opnd).m_valueType.field_0;
          pIVar10 = IR::Opnd::AsIndirOpnd(emitData->ldElemInstr->m_src1);
          other = (pIVar10->m_baseOpnd->super_Opnd).m_valueType;
          local_32[0] = (anon_union_2_4_ea848c7b_for_ValueType_13)other;
          bVar3 = ValueType::operator!=((ValueType *)&local_34.field_0,(ValueType)other);
          if (!bVar3) goto LAB_00444c35;
          ValueType::ToString((ValueType *)&local_34.field_0,
                              (wchar (*) [256])(ldValueTypeStr + 0xfc));
          ValueType::ToString((ValueType *)&local_32[0].field_0,(wchar (*) [256])local_4a8);
          if (DAT_0145948a == '\x01') {
            uVar7 = Func::GetSourceContextId(this->func);
            uVar8 = Func::GetLocalFunctionId(this->func);
            bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar7,uVar8);
            if (!bVar4) {
              uVar7 = Func::GetSourceContextId(this->func);
              uVar8 = Func::GetLocalFunctionId(this->func);
              bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar7,uVar8);
              if (!bVar4) goto LAB_00444c32;
            }
            Output::Print(L"TRACE MemCopy:");
            pJVar12 = Func::GetJITFunctionBody(this->func);
            pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
            pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_a8);
            uVar7 = Loop::GetLoopNumber(loop);
            Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar7);
            Output::Print(L"for mismatch in Load(%s) and Store(%s) value type",local_4a8,
                          ldValueTypeStr + 0xfc);
            IR::Instr::DumpByteCodeOffset(instr);
            pcVar13 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
            Output::Print(L" (%s)",pcVar13);
            Output::Print(L"\n");
            Output::Flush();
          }
LAB_00444c32:
          *errorInInstr = true;
LAB_00444c35:
          return !bVar3;
        }
      }
    }
    if (DAT_0145948a != '\x01') goto LAB_00444d6d;
    uVar7 = Func::GetSourceContextId(this->func);
    uVar8 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar7,uVar8);
    if (!bVar3) {
      uVar7 = Func::GetSourceContextId(this->func);
      uVar8 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar7,uVar8);
      if (!bVar3) goto LAB_00444d6d;
    }
    Output::Print(L"TRACE MemCopy:");
    pJVar12 = Func::GetJITFunctionBody(this->func);
    pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])(ldValueTypeStr + 0xfc));
    uVar7 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar7);
    form = L"Orphan LdElemI_A detected";
  }
  else {
    if ((OVar1 != StElemI_A_Strict) && (OVar1 != StElemI_A)) {
      return false;
    }
    bVar3 = IR::Opnd::IsIndirOpnd(instr->m_dst);
    if (bVar3) {
      pIVar10 = IR::Opnd::AsIndirOpnd(instr->m_dst);
      pGVar15 = (GlobOpt *)pIVar10->m_baseOpnd;
      pSVar11 = IR::Opnd::GetStackSym((Opnd *)pGVar15);
      SVar5 = GetVarSymID(pGVar15,pSVar11);
      if (SVar5 == pMVar16->base) {
        pIVar10 = IR::Opnd::AsIndirOpnd(instr->m_dst);
        pGVar15 = (GlobOpt *)pIVar10->m_indexOpnd;
        pSVar11 = IR::Opnd::GetStackSym((Opnd *)pGVar15);
        SVar5 = GetVarSymID(pGVar15,pSVar11);
        if (SVar5 == pMVar16->index) {
          if (instr->m_kind != InstrKindProfiled) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar9 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x447c,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
            if (!bVar3) {
LAB_00444d88:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar9 = 0;
          }
          (emitData->super_MemOpEmitData).stElemInstr = instr;
          BVar6 = IR::Instr::GetBailOutKind(instr);
          (emitData->super_MemOpEmitData).bailOutKind = BVar6;
          return false;
        }
      }
    }
    if (DAT_0145948a != '\x01') goto LAB_00444d6d;
    uVar7 = Func::GetSourceContextId(this->func);
    uVar8 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar7,uVar8);
    if (!bVar3) {
      uVar7 = Func::GetSourceContextId(this->func);
      uVar8 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar7,uVar8);
      if (!bVar3) goto LAB_00444d6d;
    }
    Output::Print(L"TRACE MemCopy:");
    pJVar12 = Func::GetJITFunctionBody(this->func);
    pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])(ldValueTypeStr + 0xfc));
    uVar7 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar7);
    form = L"Orphan StElemI_A detected";
  }
  Output::Print(form);
  IR::Instr::DumpByteCodeOffset(instr);
  pcVar13 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
  Output::Print(L" (%s)",pcVar13);
  Output::Print(L"\n");
  Output::Flush();
LAB_00444d6d:
  *errorInInstr = true;
  return false;
}

Assistant:

bool
GlobOpt::InspectInstrForMemCopyCandidate(Loop* loop, IR::Instr* instr, MemCopyEmitData* emitData, bool& errorInInstr)
{
    Assert(emitData && emitData->candidate && emitData->candidate->IsMemCopy());
    Loop::MemCopyCandidate* candidate = (Loop::MemCopyCandidate*)emitData->candidate;
    if (instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)
    {
        if (
            instr->GetDst()->IsIndirOpnd() &&
            (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetStackSym()) == candidate->base) &&
            (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetIndexOpnd()->GetStackSym()) == candidate->index)
            )
        {
            Assert(instr->IsProfiledInstr());
            emitData->stElemInstr = instr;
            emitData->bailOutKind = instr->GetBailOutKind();
            // Still need to find the LdElem
            return false;
        }
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("Orphan StElemI_A detected"));
        errorInInstr = true;
    }
    else if (instr->m_opcode == Js::OpCode::LdElemI_A)
    {
        if (
            emitData->stElemInstr &&
            instr->GetSrc1()->IsIndirOpnd() &&
            (GetVarSymID(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetStackSym()) == candidate->ldBase) &&
            (GetVarSymID(instr->GetSrc1()->AsIndirOpnd()->GetIndexOpnd()->GetStackSym()) == candidate->index)
            )
        {
            Assert(instr->IsProfiledInstr());
            emitData->ldElemInstr = instr;
            ValueType stValueType = emitData->stElemInstr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType();
            ValueType ldValueType = emitData->ldElemInstr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType();
            if (stValueType != ldValueType)
            {
#if DBG_DUMP
                char16 stValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                stValueType.ToString(stValueTypeStr);
                char16 ldValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                ldValueType.ToString(ldValueTypeStr);
                TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("for mismatch in Load(%s) and Store(%s) value type"), ldValueTypeStr, stValueTypeStr);
#endif
                errorInInstr = true;
                return false;
            }
            // We found both instruction for this candidate
            return true;
        }
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("Orphan LdElemI_A detected"));
        errorInInstr = true;
    }
    return false;
}